

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall
dtc::fdt::device_tree::reassign_fragment_numbers(device_tree *this,node_ptr *node,int *delta)

{
  int iVar1;
  element_type *peVar2;
  pointer psVar3;
  __type _Var4;
  int iVar5;
  pointer psVar6;
  string asStack_1c8 [32];
  ostringstream new_address;
  uint auStack_190 [88];
  
  peVar2 = (node->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar3 = (peVar2->children).
           super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (peVar2->children).
                super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar3; psVar6 = psVar6 + 1) {
    peVar2 = (psVar6->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&new_address,"fragment",(allocator<char> *)asStack_1c8);
    _Var4 = std::operator==(&peVar2->name,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &new_address);
    std::__cxx11::string::~string((string *)&new_address);
    if (_Var4) {
      iVar5 = std::__cxx11::stoi(&((psVar6->
                                   super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>).
                                  _M_ptr)->unit_address,(size_t *)0x0,0x10);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&new_address);
      iVar1 = *delta;
      *delta = iVar1 + iVar5 + 1;
      *(uint *)((long)auStack_190 + *(long *)(_new_address + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(_new_address + -0x18)) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)&new_address,iVar1 + iVar5);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=
                ((string *)
                 &((psVar6->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->unit_address,asStack_1c8);
      std::__cxx11::string::~string(asStack_1c8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&new_address);
    }
  }
  return;
}

Assistant:

void
device_tree::reassign_fragment_numbers(node_ptr &node, int &delta)
{

	for (auto &c : node->child_nodes())
	{
		if (c->name == std::string("fragment"))
		{
			int current_address = std::stoi(c->unit_address, nullptr, 16);
			std::ostringstream new_address;
			current_address += delta;
			// It's possible that we hopped more than one somewhere, so just reset
			// delta to the next in sequence.
			delta = current_address + 1;
			new_address << std::hex << current_address;
			c->unit_address = new_address.str();
		}
	}
}